

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

int inproc_pipe_get_addr(void *arg,void *buf,size_t *szp,nni_opt_type t)

{
  int iVar1;
  undefined1 local_b8 [8];
  nni_sockaddr sa;
  
  memset((nng_sockaddr *)local_b8,0,0x88);
  local_b8._0_2_ = 1;
  nni_strlcpy(local_b8 + 2,*arg,0x80);
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_b8,buf,szp,t);
  return iVar1;
}

Assistant:

static int
inproc_pipe_get_addr(void *arg, void *buf, size_t *szp, nni_opt_type t)
{
	inproc_pipe *p = arg;
	nni_sockaddr sa;

	memset(&sa, 0, sizeof(sa));
	sa.s_inproc.sa_family = NNG_AF_INPROC;
	nni_strlcpy(sa.s_inproc.sa_name, p->addr, sizeof(sa.s_inproc.sa_name));
	return (nni_copyout_sockaddr(&sa, buf, szp, t));
}